

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_setop_node.cpp
# Opt level: O2

unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true> __thiscall
duckdb::Binder::BindNode(Binder *this,SetOperationNode *statement)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *pvVar1;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *this_00;
  SetOperationType SVar2;
  _Head_base<0UL,_duckdb::BoundQueryNode_*,_false> _Var3;
  pointer pLVar4;
  pointer pLVar5;
  _Head_base<0UL,_duckdb::BoundSetOperationNode_*,_false> _Var6;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var7;
  bool bVar8;
  int iVar9;
  pointer pBVar10;
  idx_t iVar11;
  Binder *pBVar12;
  pointer pBVar13;
  type pBVar14;
  type pBVar15;
  type pBVar16;
  reference pvVar17;
  iterator iVar18;
  mapped_type *pmVar19;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  _Var20;
  LogicalType *other;
  reference pvVar21;
  reference pvVar22;
  undefined8 extraout_RAX;
  reference pvVar23;
  iterator iVar24;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  pointer pBVar25;
  BinderException *pBVar26;
  QueryNode *in_RDX;
  vector<unsigned_long,_true> *this_01;
  pointer *__ptr;
  size_type sVar27;
  __buckets_ptr pp_Var28;
  ulong uVar29;
  _Head_base<0UL,_duckdb::BoundSetOperationNode_*,_false> local_308;
  Expression *local_300;
  optional_ptr<duckdb::Binder,_true> local_2f8;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_2f0;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_2e8;
  type local_2e0;
  type local_2d8;
  QueryNode *local_2d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_2c8;
  vector<duckdb::LogicalType,_true> *local_2c0;
  vector<duckdb::LogicalType,_true> *local_2b8;
  type local_2b0;
  ulong local_2a8;
  size_type local_2a0;
  vector<duckdb::LogicalType,_true> *local_298;
  ulong local_290;
  __uniq_ptr_impl<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_> local_288;
  vector<unsigned_long,_true> left_reorder_idx;
  vector<unsigned_long,_true> right_reorder_idx;
  case_insensitive_map_t<idx_t> right_names_map;
  case_insensitive_map_t<idx_t> left_names_map;
  SelectBindState bind_state;
  _Vector_base<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
  local_78;
  LogicalType local_60;
  LogicalType local_48;
  
  local_2f8.ptr = (Binder *)statement;
  local_288._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundQueryNode_*,_std::default_delete<duckdb::BoundQueryNode>_>.
  super__Head_base<0UL,_duckdb::BoundQueryNode_*,_false>._M_head_impl =
       (tuple<duckdb::BoundQueryNode_*,_std::default_delete<duckdb::BoundQueryNode>_>)
       (tuple<duckdb::BoundQueryNode_*,_std::default_delete<duckdb::BoundQueryNode>_>)this;
  make_uniq<duckdb::BoundSetOperationNode>();
  SVar2 = *(SetOperationType *)&in_RDX[1]._vptr_QueryNode;
  local_2d0 = in_RDX;
  pBVar10 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                          *)&local_308);
  pBVar10->setop_type = SVar2;
  bVar8 = *(bool *)((long)&local_2d0[1]._vptr_QueryNode + 1);
  pBVar10 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                          *)&local_308);
  pBVar10->setop_all = bVar8;
  iVar11 = GenerateTableIndex(local_2f8.ptr);
  pBVar10 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                          *)&local_308);
  pBVar10->setop_index = iVar11;
  CreateBinder((Binder *)&bind_state,(local_2f8.ptr)->context,local_2f8,REGULAR_BINDER);
  pBVar10 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                          *)&local_308);
  shared_ptr<duckdb::Binder,_true>::operator=
            (&pBVar10->left_binder,(shared_ptr<duckdb::Binder,_true> *)&bind_state);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &bind_state.alias_map._M_h._M_bucket_count);
  pBVar10 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                          *)&local_308);
  pBVar12 = shared_ptr<duckdb::Binder,_true>::operator->(&pBVar10->left_binder);
  pBVar12->can_contain_nulls = true;
  pBVar10 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                          *)&local_308);
  pBVar12 = shared_ptr<duckdb::Binder,_true>::operator->(&pBVar10->left_binder);
  unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::operator*
            ((unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *)
             &local_2d0[1].type);
  BindNode((Binder *)&bind_state,(QueryNode *)pBVar12);
  pBVar10 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                          *)&local_308);
  pp_Var28 = bind_state.alias_map._M_h._M_buckets;
  bind_state.alias_map._M_h._M_buckets = (__buckets_ptr)0x0;
  _Var3._M_head_impl =
       (pBVar10->left).
       super_unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>._M_t.
       super___uniq_ptr_impl<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::BoundQueryNode_*,_std::default_delete<duckdb::BoundQueryNode>_>
       .super__Head_base<0UL,_duckdb::BoundQueryNode_*,_false>._M_head_impl;
  (pBVar10->left).
  super_unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>._M_t.
  super___uniq_ptr_impl<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundQueryNode_*,_std::default_delete<duckdb::BoundQueryNode>_>.
  super__Head_base<0UL,_duckdb::BoundQueryNode_*,_false>._M_head_impl = (BoundQueryNode *)pp_Var28;
  if ((_Var3._M_head_impl != (BoundQueryNode *)0x0) &&
     ((**(code **)((long)(_Var3._M_head_impl)->_vptr_BoundQueryNode + 8))(),
     bind_state.alias_map._M_h._M_buckets != (__buckets_ptr)0x0)) {
    (*(code *)(*bind_state.alias_map._M_h._M_buckets)[1]._M_nxt)();
  }
  CreateBinder((Binder *)&bind_state,(local_2f8.ptr)->context,local_2f8,REGULAR_BINDER);
  pBVar10 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                          *)&local_308);
  shared_ptr<duckdb::Binder,_true>::operator=
            (&pBVar10->right_binder,(shared_ptr<duckdb::Binder,_true> *)&bind_state);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &bind_state.alias_map._M_h._M_bucket_count);
  pBVar10 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                          *)&local_308);
  pBVar12 = shared_ptr<duckdb::Binder,_true>::operator->(&pBVar10->right_binder);
  pBVar12->can_contain_nulls = true;
  pBVar10 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                          *)&local_308);
  pBVar12 = shared_ptr<duckdb::Binder,_true>::operator->(&pBVar10->right_binder);
  unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::operator*
            ((unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *)
             &local_2d0[1].modifiers);
  BindNode((Binder *)&bind_state,(QueryNode *)pBVar12);
  pBVar10 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                          *)&local_308);
  pp_Var28 = bind_state.alias_map._M_h._M_buckets;
  bind_state.alias_map._M_h._M_buckets = (__buckets_ptr)0x0;
  _Var3._M_head_impl =
       (pBVar10->right).
       super_unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>._M_t.
       super___uniq_ptr_impl<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::BoundQueryNode_*,_std::default_delete<duckdb::BoundQueryNode>_>
       .super__Head_base<0UL,_duckdb::BoundQueryNode_*,_false>._M_head_impl;
  (pBVar10->right).
  super_unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>._M_t.
  super___uniq_ptr_impl<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundQueryNode_*,_std::default_delete<duckdb::BoundQueryNode>_>.
  super__Head_base<0UL,_duckdb::BoundQueryNode_*,_false>._M_head_impl = (BoundQueryNode *)pp_Var28;
  if ((_Var3._M_head_impl != (BoundQueryNode *)0x0) &&
     ((**(code **)((long)(_Var3._M_head_impl)->_vptr_BoundQueryNode + 8))(),
     bind_state.alias_map._M_h._M_buckets != (__buckets_ptr)0x0)) {
    (*(code *)(*bind_state.alias_map._M_h._M_buckets)[1]._M_nxt)();
  }
  pBVar10 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                          *)&local_308);
  pBVar13 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>::
            operator->(&pBVar10->left);
  pBVar10 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                          *)&local_308);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&(pBVar10->super_BoundQueryNode).names,
              &(pBVar13->names).
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
  pBVar10 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                          *)&local_308);
  pBVar14 = shared_ptr<duckdb::Binder,_true>::operator*(&pBVar10->left_binder);
  MoveCorrelatedExpressions(local_2f8.ptr,pBVar14);
  pBVar10 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                          *)&local_308);
  pBVar14 = shared_ptr<duckdb::Binder,_true>::operator*(&pBVar10->right_binder);
  MoveCorrelatedExpressions(local_2f8.ptr,pBVar14);
  pBVar10 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                          *)&local_308);
  if (pBVar10->setop_type != UNION_BY_NAME) {
    pBVar10 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
              ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                            *)&local_308);
    pBVar13 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
              ::operator->(&pBVar10->left);
    pLVar4 = (pBVar13->types).
             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pLVar5 = (pBVar13->types).
             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_start;
    pBVar10 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
              ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                            *)&local_308);
    pBVar13 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
              ::operator->(&pBVar10->right);
    if ((long)pLVar4 - (long)pLVar5 !=
        (long)(pBVar13->types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(pBVar13->types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_start) {
      pBVar26 = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&bind_state,
                 "Set operations can only apply to expressions with the same number of result columns"
                 ,(allocator *)&left_names_map);
      BinderException::BinderException(pBVar26,(string *)&bind_state);
      __cxa_throw(pBVar26,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  pBVar10 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                          *)&local_308);
  if (pBVar10->setop_type == UNION_BY_NAME) {
    pBVar15 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
              ::operator*((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                           *)&local_308);
    local_2a0 = CONCAT71(local_2a0._1_7_,(local_2f8.ptr)->can_contain_nulls);
    left_names_map._M_h._M_buckets = &left_names_map._M_h._M_single_bucket;
    left_names_map._M_h._M_bucket_count = 1;
    left_names_map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    left_names_map._M_h._M_element_count = 0;
    left_names_map._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    left_names_map._M_h._M_rehash_policy._M_next_resize = 0;
    left_names_map._M_h._M_single_bucket = (__node_base_ptr)0x0;
    right_names_map._M_h._M_buckets = &right_names_map._M_h._M_single_bucket;
    right_names_map._M_h._M_bucket_count = 1;
    right_names_map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    right_names_map._M_h._M_element_count = 0;
    right_names_map._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    right_names_map._M_h._M_rehash_policy._M_next_resize = 0;
    right_names_map._M_h._M_single_bucket = (__node_base_ptr)0x0;
    local_2d8 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                ::operator*(&pBVar15->left);
    local_2e0 = pBVar15;
    pBVar16 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
              ::operator*(&pBVar15->right);
    pvVar1 = &local_2d8->names;
    for (uVar29 = 0;
        uVar29 < (ulong)((long)(local_2d8->names).
                               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(local_2d8->names).
                               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5); uVar29 = uVar29 + 1)
    {
      pvVar17 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ::get<true>(pvVar1,uVar29);
      iVar18 = ::std::
               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::find(&left_names_map._M_h,pvVar17);
      if (iVar18.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
          ._M_cur != (__node_type *)0x0) {
        pBVar26 = (BinderException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&bind_state,
                   "UNION (ALL) BY NAME operation doesn\'t support duplicate names in the SELECT list - the name \"%s\" occurs multiple times in the left-hand side"
                   ,(allocator *)&right_reorder_idx);
        pvVar17 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ::get<true>(pvVar1,uVar29);
        ::std::__cxx11::string::string((string *)&left_reorder_idx,(string *)pvVar17);
        BinderException::BinderException<std::__cxx11::string>
                  (pBVar26,(string *)&bind_state,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &left_reorder_idx);
        __cxa_throw(pBVar26,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pvVar17 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ::get<true>(pvVar1,uVar29);
      pmVar19 = ::std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&left_names_map._M_h,pvVar17);
      *pmVar19 = uVar29;
    }
    pvVar1 = &pBVar16->names;
    local_2c8 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&(local_2e0->super_BoundQueryNode).names;
    local_2b0 = pBVar16;
    for (uVar29 = 0;
        uVar29 < (ulong)((long)(local_2b0->names).
                               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(local_2b0->names).
                               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5); uVar29 = uVar29 + 1)
    {
      pvVar17 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ::get<true>(pvVar1,uVar29);
      iVar18 = ::std::
               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::find(&right_names_map._M_h,pvVar17);
      if (iVar18.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
          ._M_cur != (__node_type *)0x0) {
        pBVar26 = (BinderException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&bind_state,
                   "UNION (ALL) BY NAME operation doesn\'t support duplicate names in the SELECT list - the name \"%s\" occurs multiple times in the right-hand side"
                   ,(allocator *)&right_reorder_idx);
        pvVar17 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ::get<true>(pvVar1,uVar29);
        ::std::__cxx11::string::string((string *)&left_reorder_idx,(string *)pvVar17);
        BinderException::BinderException<std::__cxx11::string>
                  (pBVar26,(string *)&bind_state,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &left_reorder_idx);
        __cxa_throw(pBVar26,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pvVar17 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ::get<true>(pvVar1,uVar29);
      iVar18 = ::std::
               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::find(&left_names_map._M_h,pvVar17);
      if (iVar18.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
          ._M_cur == (__node_type *)0x0) {
        pvVar17 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ::get<true>(pvVar1,uVar29);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(local_2c8,pvVar17);
      }
      pvVar17 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ::get<true>(pvVar1,uVar29);
      pmVar19 = ::std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&right_names_map._M_h,pvVar17);
      *pmVar19 = uVar29;
    }
    uVar29 = (long)(local_2e0->super_BoundQueryNode).names.
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(local_2e0->super_BoundQueryNode).names.
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    local_290 = uVar29;
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&left_reorder_idx.super_vector<unsigned_long,_std::allocator<unsigned_long>_>,
               (long)(local_2d8->names).
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(local_2d8->names).
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)&bind_state);
    pBVar16 = local_2b0;
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&right_reorder_idx.super_vector<unsigned_long,_std::allocator<unsigned_long>_>,
               (long)(local_2b0->names).
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(local_2b0->names).
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)&bind_state);
    local_290 = (long)local_290 >> 5;
    local_2b8 = &local_2d8->types;
    local_2c0 = &pBVar16->types;
    local_298 = &(local_2e0->super_BoundQueryNode).types;
    local_2a8 = 0;
    for (sVar27 = 0; pBVar15 = local_2e0, local_290 != sVar27; sVar27 = sVar27 + 1) {
      pvVar17 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ::get<true>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                             *)local_2c8,sVar27);
      iVar18 = ::std::
               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::find(&left_names_map._M_h,pvVar17);
      pvVar17 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ::get<true>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                             *)local_2c8,sVar27);
      _Var20._M_cur =
           (__node_type *)
           ::std::
           _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::find(&right_names_map._M_h,pvVar17);
      LogicalType::LogicalType((LogicalType *)&bind_state);
      uVar29 = uVar29 & 0xffffffffffffff00;
      if (_Var20._M_cur == (__node_type *)0x0 ||
          iVar18.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
          ._M_cur == (__node_type *)0x0) {
        if (iVar18.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
            ._M_cur == (__node_type *)0x0) {
          other = vector<duckdb::LogicalType,_true>::get<true>
                            (local_2c0,*(size_type *)((long)_Var20._M_cur + 0x28));
          this_01 = &right_reorder_idx;
        }
        else {
          other = vector<duckdb::LogicalType,_true>::get<true>
                            (local_2b8,
                             *(size_type *)
                              ((long)iVar18.
                                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                     ._M_cur + 0x28));
          this_01 = &left_reorder_idx;
          _Var20 = iVar18.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                   ._M_cur;
        }
        LogicalType::operator=((LogicalType *)&bind_state,other);
        pvVar23 = vector<unsigned_long,_true>::get<true>
                            (this_01,*(size_type *)
                                      ((long)&((_Var20._M_cur)->
                                              super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                              ).
                                              super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
                                              ._M_storage._M_storage + 0x20));
        uVar29 = CONCAT71((int7)(uVar29 >> 8),1);
        local_2a8 = uVar29;
      }
      else {
        pvVar21 = vector<duckdb::LogicalType,_true>::get<true>
                            (local_2b8,
                             *(size_type *)
                              ((long)iVar18.
                                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                     ._M_cur + 0x28));
        pvVar22 = vector<duckdb::LogicalType,_true>::get<true>
                            (local_2c0,*(size_type *)((long)_Var20._M_cur + 0x28));
        LogicalType::ForceMaxLogicalType(&local_60,pvVar21,pvVar22);
        LogicalType::operator=((LogicalType *)&bind_state,&local_60);
        LogicalType::~LogicalType(&local_60);
        if ((sVar27 != *(size_type *)
                        ((long)iVar18.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                               ._M_cur + 0x28)) ||
           (sVar27 != *(size_type *)((long)_Var20._M_cur + 0x28))) {
          local_2a8 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
        }
        pvVar23 = vector<unsigned_long,_true>::get<true>
                            (&left_reorder_idx,
                             *(size_type *)
                              ((long)iVar18.
                                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                     ._M_cur + 0x28));
        *pvVar23 = sVar27;
        pvVar23 = vector<unsigned_long,_true>::get<true>
                            (&right_reorder_idx,*(size_type *)((long)_Var20._M_cur + 0x28));
      }
      *pvVar23 = sVar27;
      if (((char)local_2a0 == '\0') &&
         (bVar8 = ExpressionBinder::ContainsNullType((LogicalType *)&bind_state), bVar8)) {
        ExpressionBinder::ExchangeNullType(&local_60,(LogicalType *)&bind_state);
        LogicalType::operator=((LogicalType *)&bind_state,&local_60);
        LogicalType::~LogicalType(&local_60);
      }
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                (&local_298->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                 ,(value_type *)&bind_state);
      LogicalType::~LogicalType((LogicalType *)&bind_state);
    }
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
              (&(local_2e0->left_reorder_idx).
                super_vector<unsigned_long,_std::allocator<unsigned_long>_>,&left_reorder_idx);
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
              (&(pBVar15->right_reorder_idx).
                super_vector<unsigned_long,_std::allocator<unsigned_long>_>,&right_reorder_idx);
    if ((local_2a8 & 1) != 0) {
      this_00 = &local_2e0->left_reorder_exprs;
      local_2e0 = (type)&local_2e0->right_reorder_exprs;
      for (sVar27 = 0; local_290 != sVar27; sVar27 = sVar27 + 1) {
        pvVar17 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ::get<true>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                               *)local_2c8,sVar27);
        iVar18 = ::std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&left_names_map._M_h,pvVar17);
        pvVar17 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ::get<true>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                               *)local_2c8,sVar27);
        iVar24 = ::std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&right_names_map._M_h,pvVar17);
        local_2e8._M_head_impl = (Expression *)0x0;
        local_2f0._M_head_impl = (Expression *)0x0;
        if (iVar24.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
            ._M_cur == (__node_type *)0x0 ||
            iVar18.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
            ._M_cur == (__node_type *)0x0) {
          if (iVar18.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
              ._M_cur == (__node_type *)0x0) {
            pvVar21 = vector<duckdb::LogicalType,_true>::get<true>(local_298,sVar27);
            LogicalType::LogicalType(&local_48,pvVar21);
            Value::Value((Value *)&bind_state,&local_48);
            make_uniq<duckdb::BoundConstantExpression,duckdb::Value>
                      ((duckdb *)&local_300,(Value *)&bind_state);
            _Var7._M_head_impl = local_2e8._M_head_impl;
            local_2e8._M_head_impl = local_300;
            local_300 = (Expression *)0x0;
            if ((_Var7._M_head_impl != (Expression *)0x0) &&
               ((*((_Var7._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])(),
               local_300 != (Expression *)0x0)) {
              (**(code **)(*(long *)local_300 + 8))();
            }
            local_300 = (Expression *)0x0;
            Value::~Value((Value *)&bind_state);
            LogicalType::~LogicalType(&local_48);
            pvVar21 = vector<duckdb::LogicalType,_true>::get<true>
                                (local_2c0,
                                 *(size_type *)
                                  ((long)iVar24.
                                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                         ._M_cur + 0x28));
            iVar9 = (*local_2b0->_vptr_BoundQueryNode[2])();
            bind_state.alias_map._M_h._M_buckets = (__buckets_ptr)CONCAT44(extraout_var_02,iVar9);
            bind_state.alias_map._M_h._M_bucket_count =
                 *(size_type *)
                  ((long)iVar24.
                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                         ._M_cur + 0x28);
            make_uniq<duckdb::BoundColumnRefExpression,duckdb::LogicalType&,duckdb::ColumnBinding>
                      ((duckdb *)&local_300,pvVar21,(ColumnBinding *)&bind_state);
            _Var7._M_head_impl = local_2f0._M_head_impl;
            local_2f0._M_head_impl = local_300;
            local_300 = (Expression *)0x0;
            if ((_Var7._M_head_impl != (Expression *)0x0) &&
               ((*((_Var7._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])(),
               local_300 != (Expression *)0x0)) {
              (*(local_300->super_BaseExpression)._vptr_BaseExpression[1])();
            }
          }
          else {
            pvVar21 = vector<duckdb::LogicalType,_true>::get<true>
                                (local_2b8,
                                 *(size_type *)
                                  ((long)iVar18.
                                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                         ._M_cur + 0x28));
            iVar9 = (*local_2d8->_vptr_BoundQueryNode[2])();
            bind_state.alias_map._M_h._M_buckets = (__buckets_ptr)CONCAT44(extraout_var,iVar9);
            bind_state.alias_map._M_h._M_bucket_count =
                 *(size_type *)
                  ((long)iVar18.
                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                         ._M_cur + 0x28);
            make_uniq<duckdb::BoundColumnRefExpression,duckdb::LogicalType&,duckdb::ColumnBinding>
                      ((duckdb *)&local_300,pvVar21,(ColumnBinding *)&bind_state);
            _Var7._M_head_impl = local_2e8._M_head_impl;
            local_2e8._M_head_impl = local_300;
            local_300 = (Expression *)0x0;
            if ((_Var7._M_head_impl != (Expression *)0x0) &&
               ((*((_Var7._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])(),
               local_300 != (Expression *)0x0)) {
              (*(local_300->super_BaseExpression)._vptr_BaseExpression[1])();
            }
            pvVar21 = vector<duckdb::LogicalType,_true>::get<true>(local_298,sVar27);
            LogicalType::LogicalType(&local_60,pvVar21);
            Value::Value((Value *)&bind_state,&local_60);
            make_uniq<duckdb::BoundConstantExpression,duckdb::Value>
                      ((duckdb *)&local_300,(Value *)&bind_state);
            _Var7._M_head_impl = local_2f0._M_head_impl;
            local_2f0._M_head_impl = local_300;
            local_300 = (Expression *)0x0;
            if ((_Var7._M_head_impl != (Expression *)0x0) &&
               ((*((_Var7._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])(),
               local_300 != (Expression *)0x0)) {
              (**(code **)(*(long *)local_300 + 8))();
            }
            local_300 = (Expression *)0x0;
            Value::~Value((Value *)&bind_state);
            LogicalType::~LogicalType(&local_60);
          }
        }
        else {
          local_2a0 = sVar27;
          pvVar21 = vector<duckdb::LogicalType,_true>::get<true>
                              (local_2b8,
                               *(size_type *)
                                ((long)iVar18.
                                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                       ._M_cur + 0x28));
          iVar9 = (*local_2d8->_vptr_BoundQueryNode[2])();
          bind_state.alias_map._M_h._M_buckets = (__buckets_ptr)CONCAT44(extraout_var_00,iVar9);
          bind_state.alias_map._M_h._M_bucket_count =
               *(size_type *)
                ((long)iVar18.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                       ._M_cur + 0x28);
          make_uniq<duckdb::BoundColumnRefExpression,duckdb::LogicalType&,duckdb::ColumnBinding>
                    ((duckdb *)&local_300,pvVar21,(ColumnBinding *)&bind_state);
          _Var7._M_head_impl = local_2e8._M_head_impl;
          local_2e8._M_head_impl = local_300;
          local_300 = (Expression *)0x0;
          if ((_Var7._M_head_impl != (Expression *)0x0) &&
             ((*((_Var7._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])(),
             local_300 != (Expression *)0x0)) {
            (*(local_300->super_BaseExpression)._vptr_BaseExpression[1])();
          }
          pvVar21 = vector<duckdb::LogicalType,_true>::get<true>
                              (local_2c0,
                               *(size_type *)
                                ((long)iVar24.
                                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                       ._M_cur + 0x28));
          iVar9 = (*local_2b0->_vptr_BoundQueryNode[2])();
          bind_state.alias_map._M_h._M_buckets = (__buckets_ptr)CONCAT44(extraout_var_01,iVar9);
          bind_state.alias_map._M_h._M_bucket_count =
               *(size_type *)
                ((long)iVar24.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                       ._M_cur + 0x28);
          make_uniq<duckdb::BoundColumnRefExpression,duckdb::LogicalType&,duckdb::ColumnBinding>
                    ((duckdb *)&local_300,pvVar21,(ColumnBinding *)&bind_state);
          _Var7._M_head_impl = local_2f0._M_head_impl;
          local_2f0._M_head_impl = local_300;
          local_300 = (Expression *)0x0;
          sVar27 = local_2a0;
          if ((_Var7._M_head_impl != (Expression *)0x0) &&
             ((*((_Var7._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])(),
             sVar27 = local_2a0, local_300 != (Expression *)0x0)) {
            (*(local_300->super_BaseExpression)._vptr_BaseExpression[1])();
            sVar27 = local_2a0;
          }
        }
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)this_00,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_2e8);
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)local_2e0,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_2f0);
        if (local_2f0._M_head_impl != (Expression *)0x0) {
          (*((local_2f0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
        }
        if (local_2e8._M_head_impl != (Expression *)0x0) {
          (*((local_2e8._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
        }
      }
    }
    ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&right_reorder_idx);
    ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&left_reorder_idx);
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&right_names_map._M_h);
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&left_names_map._M_h);
  }
  else {
    uVar29 = 0;
    while( true ) {
      pBVar10 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                              *)&local_308);
      pBVar13 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                ::operator->(&pBVar10->left);
      if ((ulong)(((long)(pBVar13->types).
                         super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                         super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pBVar13->types).
                        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= uVar29) break;
      pBVar10 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                              *)&local_308);
      pBVar13 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                ::operator->(&pBVar10->left);
      pvVar21 = vector<duckdb::LogicalType,_true>::get<true>(&pBVar13->types,uVar29);
      pBVar10 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                              *)&local_308);
      pBVar13 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                ::operator->(&pBVar10->right);
      pvVar22 = vector<duckdb::LogicalType,_true>::get<true>(&pBVar13->types,uVar29);
      LogicalType::ForceMaxLogicalType((LogicalType *)&bind_state,pvVar21,pvVar22);
      if (((local_2f8.ptr)->can_contain_nulls == false) &&
         (bVar8 = ExpressionBinder::ContainsNullType((LogicalType *)&bind_state), bVar8)) {
        ExpressionBinder::ExchangeNullType
                  ((LogicalType *)&left_names_map,(LogicalType *)&bind_state);
        LogicalType::operator=((LogicalType *)&bind_state,(LogicalType *)&left_names_map);
        LogicalType::~LogicalType((LogicalType *)&left_names_map);
      }
      pBVar10 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                              *)&local_308);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                (&(pBVar10->super_BoundQueryNode).types.
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                 (value_type *)&bind_state);
      LogicalType::~LogicalType((LogicalType *)&bind_state);
      uVar29 = uVar29 + 1;
    }
  }
  SelectBindState::SelectBindState(&bind_state);
  if ((local_2d0->modifiers).
      super_vector<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (local_2d0->modifiers).
      super_vector<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pBVar10 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
              ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                            *)&local_308);
    if (pBVar10->setop_type == UNION_BY_NAME) {
      pBVar10 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                              *)&local_308);
      pBVar16 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                ::operator*(&pBVar10->left);
      pBVar10 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                              *)&local_308);
      GatherAliases(pBVar16,&bind_state,&pBVar10->left_reorder_idx);
      pBVar10 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                              *)&local_308);
      pBVar16 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                ::operator*(&pBVar10->right);
      pBVar10 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                              *)&local_308);
      GatherAliases(pBVar16,&bind_state,&pBVar10->right_reorder_idx);
    }
    else {
      left_names_map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      left_names_map._M_h._M_buckets = (__buckets_ptr)0x0;
      left_names_map._M_h._M_bucket_count = 0;
      pp_Var28 = (__buckets_ptr)0x0;
      while (right_names_map._M_h._M_buckets = pp_Var28,
            pBVar10 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                      ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                                    *)&local_308),
            pp_Var28 <
            (__buckets_ptr)
            ((long)(pBVar10->super_BoundQueryNode).names.
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(pBVar10->super_BoundQueryNode).names.
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5)) {
        ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&left_names_map,
                   (value_type_conflict *)&right_names_map);
        pp_Var28 = (__buckets_ptr)((long)right_names_map._M_h._M_buckets + 1);
      }
      pBVar15 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                ::operator*((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                             *)&local_308);
      GatherAliases(&pBVar15->super_BoundQueryNode,&bind_state,
                    (vector<unsigned_long,_true> *)&left_names_map);
      ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&left_names_map);
    }
    right_names_map._M_h._M_buckets = (__buckets_ptr)0x0;
    right_names_map._M_h._M_bucket_count = 0;
    right_names_map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    pBVar10 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
              ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                            *)&local_308);
    pBVar16 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
              ::operator*(&pBVar10->left);
    pBVar10 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
              ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                            *)&local_308);
    pBVar14 = shared_ptr<duckdb::Binder,_true>::operator*(&pBVar10->left_binder);
    GatherSetOpBinders(pBVar16,pBVar14,
                       (vector<std::reference_wrapper<duckdb::Binder>,_true> *)&right_names_map);
    pBVar10 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
              ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                            *)&local_308);
    pBVar16 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
              ::operator*(&pBVar10->right);
    pBVar10 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
              ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                            *)&local_308);
    pBVar14 = shared_ptr<duckdb::Binder,_true>::operator*(&pBVar10->right_binder);
    GatherSetOpBinders(pBVar16,pBVar14,
                       (vector<std::reference_wrapper<duckdb::Binder>,_true> *)&right_names_map);
    ::std::
    vector<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
    ::vector((vector<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
              *)&local_78,
             (vector<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
              *)&right_names_map);
    OrderBinder::OrderBinder
              ((OrderBinder *)&left_names_map,
               (vector<std::reference_wrapper<duckdb::Binder>,_true> *)&local_78,&bind_state);
    ::std::
    _Vector_base<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
    ::~_Vector_base(&local_78);
    pBVar15 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
              ::operator*((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                           *)&local_308);
    PrepareModifiers(local_2f8.ptr,(OrderBinder *)&left_names_map,local_2d0,
                     &pBVar15->super_BoundQueryNode);
    OrderBinder::~OrderBinder((OrderBinder *)&left_names_map);
    ::std::
    _Vector_base<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
    ::~_Vector_base((_Vector_base<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
                     *)&right_names_map);
  }
  pBVar15 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
            ::operator*((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                         *)&local_308);
  pBVar10 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                          *)&local_308);
  iVar11 = pBVar10->setop_index;
  pBVar10 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                          *)&local_308);
  pBVar25 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                          *)&local_308);
  BindModifiers(local_2f8.ptr,&pBVar15->super_BoundQueryNode,iVar11,
                &(pBVar10->super_BoundQueryNode).names,&(pBVar25->super_BoundQueryNode).types,
                &bind_state);
  _Var6._M_head_impl = local_308._M_head_impl;
  local_308._M_head_impl = (BoundSetOperationNode *)0x0;
  *(BoundSetOperationNode **)
   local_288._M_t.
   super__Tuple_impl<0UL,_duckdb::BoundQueryNode_*,_std::default_delete<duckdb::BoundQueryNode>_>.
   super__Head_base<0UL,_duckdb::BoundQueryNode_*,_false>._M_head_impl = _Var6._M_head_impl;
  SelectBindState::~SelectBindState(&bind_state);
  if (local_308._M_head_impl != (BoundSetOperationNode *)0x0) {
    (*((local_308._M_head_impl)->super_BoundQueryNode)._vptr_BoundQueryNode[1])();
  }
  return (unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>)
         (_Tuple_impl<0UL,_duckdb::BoundQueryNode_*,_std::default_delete<duckdb::BoundQueryNode>_>)
         local_288._M_t.
         super__Tuple_impl<0UL,_duckdb::BoundQueryNode_*,_std::default_delete<duckdb::BoundQueryNode>_>
         .super__Head_base<0UL,_duckdb::BoundQueryNode_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<BoundQueryNode> Binder::BindNode(SetOperationNode &statement) {
	auto result = make_uniq<BoundSetOperationNode>();
	result->setop_type = statement.setop_type;
	result->setop_all = statement.setop_all;

	// first recursively visit the set operations
	// both the left and right sides have an independent BindContext and Binder
	D_ASSERT(statement.left);
	D_ASSERT(statement.right);

	result->setop_index = GenerateTableIndex();

	result->left_binder = Binder::CreateBinder(context, this);
	result->left_binder->can_contain_nulls = true;
	result->left = result->left_binder->BindNode(*statement.left);
	result->right_binder = Binder::CreateBinder(context, this);
	result->right_binder->can_contain_nulls = true;
	result->right = result->right_binder->BindNode(*statement.right);

	result->names = result->left->names;

	// move the correlated expressions from the child binders to this binder
	MoveCorrelatedExpressions(*result->left_binder);
	MoveCorrelatedExpressions(*result->right_binder);

	// now both sides have been bound we can resolve types
	if (result->setop_type != SetOperationType::UNION_BY_NAME &&
	    result->left->types.size() != result->right->types.size()) {
		throw BinderException("Set operations can only apply to expressions with the "
		                      "same number of result columns");
	}

	if (result->setop_type == SetOperationType::UNION_BY_NAME) {
		BuildUnionByNameInfo(context, *result, can_contain_nulls);
	} else {
		// figure out the types of the setop result by picking the max of both
		for (idx_t i = 0; i < result->left->types.size(); i++) {
			auto result_type = LogicalType::ForceMaxLogicalType(result->left->types[i], result->right->types[i]);
			if (!can_contain_nulls) {
				if (ExpressionBinder::ContainsNullType(result_type)) {
					result_type = ExpressionBinder::ExchangeNullType(result_type);
				}
			}
			result->types.push_back(result_type);
		}
	}

	SelectBindState bind_state;
	if (!statement.modifiers.empty()) {
		// handle the ORDER BY/DISTINCT clauses

		// we recursively visit the children of this node to extract aliases and expressions that can be referenced
		// in the ORDER BY

		if (result->setop_type == SetOperationType::UNION_BY_NAME) {
			GatherAliases(*result->left, bind_state, result->left_reorder_idx);
			GatherAliases(*result->right, bind_state, result->right_reorder_idx);
		} else {
			vector<idx_t> reorder_idx;
			for (idx_t i = 0; i < result->names.size(); i++) {
				reorder_idx.push_back(i);
			}
			GatherAliases(*result, bind_state, reorder_idx);
		}
		// now we perform the actual resolution of the ORDER BY/DISTINCT expressions
		vector<reference<Binder>> binders;
		GatherSetOpBinders(*result->left, *result->left_binder, binders);
		GatherSetOpBinders(*result->right, *result->right_binder, binders);
		OrderBinder order_binder(binders, bind_state);
		PrepareModifiers(order_binder, statement, *result);
	}

	// finally bind the types of the ORDER/DISTINCT clause expressions
	BindModifiers(*result, result->setop_index, result->names, result->types, bind_state);
	return std::move(result);
}